

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

bool bssl::dtls1_parse_fragment(CBS *cbs,hm_header_st *out_hdr,CBS *out_body)

{
  int iVar1;
  
  out_hdr->type = '\0';
  *(undefined3 *)&out_hdr->field_0x1 = 0;
  out_hdr->msg_len = 0;
  out_hdr->seq = 0;
  *(undefined2 *)&out_hdr->field_0xa = 0;
  out_hdr->frag_off = 0;
  out_hdr->frag_len = 0;
  iVar1 = CBS_get_u8(cbs,&out_hdr->type);
  if ((((iVar1 != 0) && (iVar1 = CBS_get_u24(cbs,&out_hdr->msg_len), iVar1 != 0)) &&
      (iVar1 = CBS_get_u16(cbs,&out_hdr->seq), iVar1 != 0)) &&
     (iVar1 = CBS_get_u24(cbs,&out_hdr->frag_off), iVar1 != 0)) {
    iVar1 = CBS_get_u24(cbs,&out_hdr->frag_len);
    if (iVar1 != 0) {
      iVar1 = CBS_get_bytes(cbs,out_body,(ulong)out_hdr->frag_len);
      return iVar1 != 0;
    }
  }
  return false;
}

Assistant:

bool dtls1_parse_fragment(CBS *cbs, struct hm_header_st *out_hdr,
                          CBS *out_body) {
  OPENSSL_memset(out_hdr, 0x00, sizeof(struct hm_header_st));

  if (!CBS_get_u8(cbs, &out_hdr->type) ||
      !CBS_get_u24(cbs, &out_hdr->msg_len) ||
      !CBS_get_u16(cbs, &out_hdr->seq) ||
      !CBS_get_u24(cbs, &out_hdr->frag_off) ||
      !CBS_get_u24(cbs, &out_hdr->frag_len) ||
      !CBS_get_bytes(cbs, out_body, out_hdr->frag_len)) {
    return false;
  }

  return true;
}